

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

void __thiscall
libDAI::JTree::GenerateJT
          (JTree *this,vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *Cliques)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *pvVar1;
  long lVar2;
  _func_int *p_Var3;
  pointer pDVar4;
  pointer pVVar5;
  pointer pVVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  pointer pVVar10;
  mapped_type_conflict1 *pmVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  ostream *poVar13;
  undefined4 extraout_var_28;
  pointer pVVar14;
  pointer pVVar15;
  size_t e;
  pointer pVVar16;
  size_t I;
  size_t alpha;
  long lVar17;
  size_t alpha_1;
  ulong uVar18;
  FRegion local_f8;
  pointer local_b8;
  long local_b0;
  undefined8 local_a8;
  pointer local_a0;
  WeightedGraph<int> JuncGraph;
  TFactor<double> local_68;
  
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  local_a8 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x28))
                       ((long *)CONCAT44(extraout_var,iVar8));
  JuncGraph.
  super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &JuncGraph.
        super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  JuncGraph.
  super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  JuncGraph.
  super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  JuncGraph.
  super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar14 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pVVar10 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar17 = 0x20;
  pVVar16 = (pointer)0x0;
  JuncGraph.
  super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       JuncGraph.
       super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pVVar16 < (pointer)((long)pVVar10 - (long)pVVar14 >> 5)) {
    pVVar15 = (pointer)((long)&pVVar16->_label + 1);
    local_b8 = pVVar15;
    local_b0 = lVar17;
    local_a0 = pVVar16;
    for (; pVVar15 < (pointer)((long)pVVar10 - (long)pVVar14 >> 5);
        pVVar15 = (pointer)((long)&pVVar15->_label + 1)) {
      VarSet::operator&((VarSet *)&local_f8,pVVar14 + (long)pVVar16,
                        (VarSet *)
                        ((long)&(pVVar14->_vars).
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar17));
      pVVar6 = local_f8.super_Factor._vs._vars.
               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar5 = local_f8.super_Factor._vs._vars.
               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)local_f8.super_Factor._vs._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super_Factor._vs._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_f8);
      if (pVVar6 != pVVar5) {
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = local_a0;
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar15;
        pmVar11 = std::
                  map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                  ::operator[](&JuncGraph.
                                super_map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                               ,(key_type *)&local_f8);
        *pmVar11 = (int)local_a8 - (int)(uVar18 >> 4);
      }
      lVar17 = lVar17 + 0x20;
      pVVar14 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pVVar10 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    lVar17 = local_b0 + 0x20;
    pVVar16 = local_b8;
  }
  MinSpanningTreePrims<int>((DEdgeVec *)&local_f8,&JuncGraph);
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::_M_move_assign
            (&this->_RTree,&local_f8);
  std::_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~_Vector_base
            ((_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)&local_f8);
  iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
             (CONCAT44(extraout_var_00,iVar8) + 0xe0),
             (long)(Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  lVar17 = 0;
  for (uVar18 = 0;
      uVar18 < (ulong)((long)(Cliques->
                             super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(Cliques->
                             super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 5); uVar18 = uVar18 + 1) {
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&local_68,
               (VarSet *)
               ((long)&(((Cliques->
                         super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                         _M_impl.super__Vector_impl_data._M_start)->_vars).
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17),1.0);
    TFactor<double>::TFactor(&local_f8.super_Factor,&local_68);
    local_f8._c = 1.0;
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
              ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
               (CONCAT44(extraout_var_01,iVar8) + 0xe0),&local_f8);
    TFactor<double>::~TFactor(&local_f8.super_Factor);
    TFactor<double>::~TFactor(&local_68);
    lVar17 = lVar17 + 0x20;
  }
  uVar18 = 0;
  do {
    iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x48))
                       ((long *)CONCAT44(extraout_var_02,iVar8));
    if (uVar12 <= uVar18) {
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      RegionGraph::RecomputeORs((RegionGraph *)CONCAT44(extraout_var_07,iVar8));
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
                ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                 (CONCAT44(extraout_var_08,iVar8) + 0xf8),
                 (long)(this->_RTree).
                       super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->_RTree).
                       super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4);
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)(CONCAT44(extraout_var_09,iVar8) + 0x110),
                (long)(this->_RTree).
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_RTree).
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
      lVar17 = 0;
      uVar18 = 0;
      while( true ) {
        p_Var3 = (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5];
        if ((ulong)((long)(this->_RTree).
                          super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->_RTree).
                          super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4) <= uVar18) break;
        iVar8 = (*p_Var3)(this);
        pDVar4 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((*(long *)(CONCAT44(extraout_var_11,iVar9) + 0x100) -
                       *(long *)(CONCAT44(extraout_var_11,iVar9) + 0xf8)) / 0x28);
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)((long)&pDVar4->n1 + lVar17);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)(CONCAT44(extraout_var_10,iVar8) + 0x110),
                   (pair<unsigned_long,_unsigned_long> *)&local_f8);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        pDVar4 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar9 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((*(long *)(CONCAT44(extraout_var_13,iVar9) + 0x100) -
                       *(long *)(CONCAT44(extraout_var_13,iVar9) + 0xf8)) / 0x28);
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)((long)&pDVar4->n2 + lVar17);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)(CONCAT44(extraout_var_12,iVar8) + 0x110),
                   (pair<unsigned_long,_unsigned_long> *)&local_f8);
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        pDVar4 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar14 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        VarSet::operator&(&local_68._vs,pVVar14 + *(long *)((long)&pDVar4->n1 + lVar17),
                          pVVar14 + *(long *)((long)&pDVar4->n2 + lVar17));
        VarSet::VarSet((VarSet *)&local_f8,&local_68._vs);
        local_f8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::emplace_back<libDAI::Region>
                  ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                   (CONCAT44(extraout_var_14,iVar8) + 0xf8),(Region *)&local_f8);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_f8);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_68);
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x10;
      }
      iVar8 = (*p_Var3)(this);
      BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate
                ((BipartiteGraph<libDAI::FRegion,_libDAI::Region> *)
                 (CONCAT44(extraout_var_15,iVar8) + 0xe0));
      pvVar1 = &this->_Qa;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1)
      ;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,*(long *)(CONCAT44(extraout_var_16,iVar8) + 0xe8) -
                        *(long *)(CONCAT44(extraout_var_16,iVar8) + 0xe0) >> 6);
      lVar17 = 0;
      uVar18 = 0;
      while( true ) {
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        if ((ulong)(*(long *)(CONCAT44(extraout_var_17,iVar8) + 0xe8) -
                    *(long *)(CONCAT44(extraout_var_17,iVar8) + 0xe0) >> 6) <= uVar18) break;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  (pvVar1,(value_type *)(*(long *)(CONCAT44(extraout_var_18,iVar8) + 0xe0) + lVar17)
                  );
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x40;
      }
      pvVar1 = &this->_Qb;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1)
      ;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,(*(long *)(CONCAT44(extraout_var_19,iVar8) + 0x100) -
                        *(long *)(CONCAT44(extraout_var_19,iVar8) + 0xf8)) / 0x28);
      lVar17 = 0;
      uVar18 = 0;
      while( true ) {
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        if ((ulong)((*(long *)(CONCAT44(extraout_var_20,iVar8) + 0x100) -
                    *(long *)(CONCAT44(extraout_var_20,iVar8) + 0xf8)) / 0x28) <= uVar18) break;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
        TFactor<double>::TFactor
                  (&local_f8.super_Factor,
                   (VarSet *)(*(long *)(CONCAT44(extraout_var_21,iVar8) + 0xf8) + lVar17),1.0);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1
                   ,&local_f8.super_Factor);
        TFactor<double>::~TFactor(&local_f8.super_Factor);
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x28;
      }
      pvVar1 = &this->_mes;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear(pvVar1)
      ;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,*(long *)(CONCAT44(extraout_var_22,iVar8) + 0x118) -
                        *(long *)(CONCAT44(extraout_var_22,iVar8) + 0x110) >> 4);
      lVar17 = 8;
      uVar18 = 0;
      while( true ) {
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if ((ulong)(*(long *)(CONCAT44(extraout_var_23,iVar8) + 0x118) -
                    *(long *)(CONCAT44(extraout_var_23,iVar8) + 0x110) >> 4) <= uVar18) break;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        iVar9 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::TFactor
                  (&local_f8.super_Factor,
                   (VarSet *)
                   (*(long *)(*(long *)(CONCAT44(extraout_var_25,iVar9) + 0x110) + lVar17) * 0x28 +
                   *(long *)(CONCAT44(extraout_var_24,iVar8) + 0xf8)),1.0);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1
                   ,&local_f8.super_Factor);
        TFactor<double>::~TFactor(&local_f8.super_Factor);
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x10;
      }
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      RegionGraph::Check_Counting_Numbers((RegionGraph *)CONCAT44(extraout_var_26,iVar8));
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_27,iVar8)) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Resulting regiongraph: ");
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        poVar13 = libDAI::operator<<(poVar13,(RegionGraph *)CONCAT44(extraout_var_28,iVar8));
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      std::
      _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_int>,_std::_Select1st<std::pair<const_libDAI::UEdge,_int>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
      ::~_Rb_tree((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_int>,_std::_Select1st<std::pair<const_libDAI::UEdge,_int>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                   *)&JuncGraph);
      return;
    }
    lVar17 = 0;
    uVar12 = 0;
    while( true ) {
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_03,iVar8) + 0xe8) -
                  *(long *)(CONCAT44(extraout_var_03,iVar8) + 0xe0) >> 6) <= uVar12) break;
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar2 = *(long *)(CONCAT44(extraout_var_04,iVar8) + 0xe0);
      iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      ns = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x50))
                     ((long *)CONCAT44(extraout_var_05,iVar8),uVar18);
      bVar7 = VarSet::includes((VarSet *)(lVar2 + lVar17),ns);
      if (bVar7) {
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        RegionGraph::setFac2OR((RegionGraph *)CONCAT44(extraout_var_06,iVar8),uVar18,uVar12);
        break;
      }
      uVar12 = uVar12 + 1;
      lVar17 = lVar17 + 0x40;
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void JTree::GenerateJT( const std::vector<VarSet> &Cliques ) {
        // Construct a weighted graph (each edge is weighted with the cardinality 
        // of the intersection of the nodes, where the nodes are the elements of
        // Cliques).
        size_t N = grm().nrVars();
        WeightedGraph<int> JuncGraph;
        for( size_t i = 0; i < Cliques.size(); i++ )
            for( size_t j = i+1; j < Cliques.size(); j++ ) {
                size_t w = (Cliques[i] & Cliques[j]).size();
                if( w ) 
                    JuncGraph[UEdge(i,j)] = N - w;
            }
        
        // Construct minimal spanning tree using Prim's algorithm
        _RTree = MinSpanningTreePrims( JuncGraph);

        // Construct corresponding region graph

        // Create outer regions
        grm().ORs().reserve( Cliques.size() );
        for( size_t i = 0; i < Cliques.size(); i++ )
            grm().ORs().push_back( FRegion( Factor(Cliques[i], 1.0), 1.0 ) );

        // For each factor, find an outer region that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                if( grm().OR(alpha).vars() >> grm().factor(I).vars() ) {
    //              grm().OR(alpha) *= grm().factor(I);
                    grm().setFac2OR(I, alpha);
                    break;
                }
            assert( alpha != grm().nr_ORs() );
        }
        grm().RecomputeORs();

        // Create inner regions and edges
        grm().IRs().reserve( _RTree.size() );
        grm().Redges().reserve( 2 * _RTree.size() );
        for( size_t i = 0; i < _RTree.size(); i++ ) {
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n1, grm().IRs().size() ) );
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n2, grm().IRs().size() ) );
            // inner clusters have counting number -1
            grm().IRs().push_back( Region( Cliques[_RTree[i].n1] & Cliques[_RTree[i].n2], -1.0 ) );
        }

        // Regenerate BipartiteGraph internals
        grm().Regenerate();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 ) {
            cout << "Resulting regiongraph: " << grm() << endl;
        }
    }